

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O1

DdNode * Cudd_bddComputeCube(DdManager *dd,DdNode **vars,int *phase,int n)

{
  int *piVar1;
  DdNode *pDVar2;
  long lVar3;
  DdNode *g;
  
  pDVar2 = dd->one;
  piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
  *piVar1 = *piVar1 + 1;
  if (0 < n) {
    lVar3 = (ulong)(uint)n + 1;
    g = pDVar2;
    do {
      if ((phase == (int *)0x0) || (phase[lVar3 + -2] != 0)) {
        pDVar2 = vars[lVar3 + -2];
      }
      else {
        pDVar2 = (DdNode *)((ulong)vars[lVar3 + -2] ^ 1);
      }
      pDVar2 = Cudd_bddAnd(dd,pDVar2,g);
      if (pDVar2 == (DdNode *)0x0) {
        Cudd_RecursiveDeref(dd,g);
        return (DdNode *)0x0;
      }
      piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      Cudd_RecursiveDeref(dd,g);
      lVar3 = lVar3 + -1;
      g = pDVar2;
    } while (1 < lVar3);
  }
  piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
  *piVar1 = *piVar1 + -1;
  return pDVar2;
}

Assistant:

DdNode *
Cudd_bddComputeCube(
  DdManager * dd,
  DdNode ** vars,
  int * phase,
  int  n)
{
    DdNode      *cube;
    DdNode      *fn;
    int         i;

    cube = DD_ONE(dd);
    cuddRef(cube);

    for (i = n - 1; i >= 0; i--) {
        if (phase == NULL || phase[i] != 0) {
            fn = Cudd_bddAnd(dd,vars[i],cube);
        } else {
            fn = Cudd_bddAnd(dd,Cudd_Not(vars[i]),cube);
        }
        if (fn == NULL) {
            Cudd_RecursiveDeref(dd,cube);
            return(NULL);
        }
        cuddRef(fn);
        Cudd_RecursiveDeref(dd,cube);
        cube = fn;
    }
    cuddDeref(cube);

    return(cube);

}